

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VertexAttribLocationAPITest::~VertexAttribLocationAPITest
          (VertexAttribLocationAPITest *this)

{
  VertexAttribLocationAPITest *this_local;
  
  ~VertexAttribLocationAPITest(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

~VertexAttribLocationAPITest()
	{
	}